

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase982::run(TestCase982 *this)

{
  Own<capnp::_::(anonymous_namespace)::TestThisCap> *server_00;
  char *in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __flags;
  char *in_R8;
  int local_370;
  bool local_369;
  undefined1 local_368 [7];
  bool _kj_shouldLog_5;
  int local_350;
  bool local_349;
  undefined1 local_348 [7];
  bool _kj_shouldLog_4;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_330;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_2f8;
  Response<capnproto_test::capnp::test::TestInterface::BarResults> local_2c0;
  int local_280;
  bool local_279;
  undefined1 local_278 [7];
  bool _kj_shouldLog_3;
  int local_260;
  bool local_259;
  undefined1 local_258 [7];
  bool _kj_shouldLog_2;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_240;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_208;
  Response<capnproto_test::capnp::test::TestInterface::BarResults> local_1d0;
  int local_190;
  bool local_189;
  undefined1 local_188 [7];
  bool _kj_shouldLog_1;
  Client client2;
  undefined1 local_168 [7];
  bool _kj_shouldLog;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_150;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_118;
  Response<capnproto_test::capnp::test::TestInterface::BarResults> local_e0;
  undefined1 local_a0 [8];
  Client client;
  TestThisCap *serverPtr;
  Own<capnp::_::(anonymous_namespace)::TestThisCap> server;
  undefined1 local_60 [8];
  WaitScope waitScope;
  EventLoop loop;
  int callCount;
  TestCase982 *this_local;
  
  loop.daemons.ptr._4_4_ = 0;
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_60,(EventLoop *)&waitScope.busyPollInterval);
  kj::heap<capnp::_::(anonymous_namespace)::TestThisCap,int&>
            ((kj *)&serverPtr,(int *)((long)&loop.daemons.ptr + 4));
  client._16_8_ = kj::Own::operator_cast_to_TestThisCap_((Own *)&serverPtr);
  server_00 = kj::mv<kj::Own<capnp::_::(anonymous_namespace)::TestThisCap>>
                        ((Own<capnp::_::(anonymous_namespace)::TestThisCap> *)&serverPtr);
  capnproto_test::capnp::test::TestInterface::Client::
  Client<capnp::_::(anonymous_namespace)::TestThisCap,void>((Client *)local_a0,server_00);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_168,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_150,(Client *)local_a0,(Maybe<capnp::MessageSize> *)local_168);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send(&local_118,(int)&local_150,__buf,(size_t)in_RCX,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> *)
             &local_e0,&local_118);
  Response<capnproto_test::capnp::test::TestInterface::BarResults>::~Response(&local_e0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)&local_118);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::~Request(&local_150);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_168);
  if (loop.daemons.ptr._4_4_ != 1) {
    client2._23_1_ = kj::_::Debug::shouldLog(ERROR);
    while (client2._23_1_ != '\0') {
      client2._16_4_ = 1;
      in_RCX = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
      in_R8 = "failed: expected (1) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3e0,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
                 (char (*) [36])"failed: expected (1) == (callCount)",(int *)&client2.field_0x10,
                 (int *)((long)&loop.daemons.ptr + 4));
      client2._23_1_ = 0;
    }
  }
  TestThisCap::getSelf((Client *)local_188,(TestThisCap *)client._16_8_);
  if (loop.daemons.ptr._4_4_ != 1) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      local_190 = 1;
      in_RCX = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
      in_R8 = "failed: expected (1) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3e3,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
                 (char (*) [36])"failed: expected (1) == (callCount)",&local_190,
                 (int *)((long)&loop.daemons.ptr + 4));
      local_189 = false;
    }
  }
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_258,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_240,(Client *)local_188,(Maybe<capnp::MessageSize> *)local_258);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send(&local_208,(int)&local_240,__buf_00,(size_t)in_RCX,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> *)
             &local_1d0,&local_208);
  Response<capnproto_test::capnp::test::TestInterface::BarResults>::~Response(&local_1d0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)&local_208);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::~Request(&local_240);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_258);
  if (loop.daemons.ptr._4_4_ != 2) {
    local_259 = kj::_::Debug::shouldLog(ERROR);
    while (local_259 != false) {
      local_260 = 2;
      in_RCX = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
      in_R8 = "failed: expected (2) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3e5,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",&local_260,
                 (int *)((long)&loop.daemons.ptr + 4));
      local_259 = false;
    }
  }
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_278,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::operator=
            ((Client *)local_a0,(Client *)local_278);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_278);
  __flags = (int)in_R8;
  if (loop.daemons.ptr._4_4_ != 2) {
    local_279 = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)in_R8, local_279 != false) {
      local_280 = 2;
      in_RCX = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
      in_R8 = "failed: expected (2) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3e9,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",&local_280,
                 (int *)((long)&loop.daemons.ptr + 4));
      local_279 = false;
    }
  }
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_348,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_330,(Client *)local_188,(Maybe<capnp::MessageSize> *)local_348);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send(&local_2f8,(int)&local_330,__buf_01,(size_t)in_RCX,__flags);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> *)
             &local_2c0,&local_2f8);
  Response<capnproto_test::capnp::test::TestInterface::BarResults>::~Response(&local_2c0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)&local_2f8);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::~Request(&local_330);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_348);
  if (loop.daemons.ptr._4_4_ != 3) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      local_350 = 3;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3eb,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
                 (char (*) [36])"failed: expected (3) == (callCount)",&local_350,
                 (int *)((long)&loop.daemons.ptr + 4));
      local_349 = false;
    }
  }
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_368,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::operator=
            ((Client *)local_188,(Client *)local_368);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_368);
  if (loop.daemons.ptr._4_4_ != -1) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      local_370 = -1;
      kj::_::Debug::log<char_const(&)[37],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3ef,ERROR,"\"failed: expected \" \"(-1) == (callCount)\", -1, callCount",
                 (char (*) [37])"failed: expected (-1) == (callCount)",&local_370,
                 (int *)((long)&loop.daemons.ptr + 4));
      local_369 = false;
    }
  }
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_188);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_a0);
  kj::Own<capnp::_::(anonymous_namespace)::TestThisCap>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestThisCap> *)&serverPtr);
  kj::WaitScope::~WaitScope((WaitScope *)local_60);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, ThisCap) {
  int callCount = 0;
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto server = kj::heap<TestThisCap>(callCount);
  TestThisCap* serverPtr = server;

  test::TestInterface::Client client = kj::mv(server);
  client.barRequest().send().wait(waitScope);
  EXPECT_EQ(1, callCount);

  test::TestInterface::Client client2 = serverPtr->getSelf();
  EXPECT_EQ(1, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(2, callCount);

  client = nullptr;

  EXPECT_EQ(2, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(3, callCount);

  client2 = nullptr;

  EXPECT_EQ(-1, callCount);
}